

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

Point __thiscall Board::find_king(Board *this,Color color)

{
  long lVar1;
  Board *pBVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  undefined4 uVar6;
  pointer pvVar7;
  undefined8 uVar8;
  dimension y;
  ulong uVar9;
  ushort x;
  undefined7 in_register_00000031;
  bool bVar10;
  Point local_78;
  Point local_74;
  Point local_70;
  Point local_6c;
  Board *local_68;
  uint local_60;
  undefined4 local_5c;
  ulong local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_5c = (undefined4)CONCAT71(in_register_00000031,color);
  uVar8 = 0;
  uVar9 = 0;
  local_68 = this;
  do {
    local_60 = (uint)uVar8;
    bVar10 = false;
    y = (dimension)uVar9;
    x = 0;
    local_58 = uVar9;
    do {
      pBVar2 = local_68;
      Point::Point(&local_6c,x,y);
      pvVar7 = (pBVar2->m_board).m_data.
               super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar1 = *(long *)(*(long *)&pvVar7[local_6c.m_x].
                                  super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                       + (long)local_6c.m_y * 0x10);
      if (lVar1 == 0) {
LAB_0010745f:
        bVar3 = 0;
      }
      else {
        Point::Point(&local_70,x,y);
        pvVar7 = (pBVar2->m_board).m_data.
                 super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (**(code **)(**(long **)(*(long *)&pvVar7[local_70.m_x].
                                           super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                + (long)local_70.m_y * 0x10) + 0x18))(local_50);
        iVar4 = std::__cxx11::string::compare((char *)local_50);
        if (iVar4 != 0) goto LAB_0010745f;
        Point::Point(&local_74,x,y);
        pvVar7 = (local_68->m_board).m_data.
                 super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = (**(code **)(**(long **)(*(long *)&pvVar7[local_74.m_x].
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                        + (long)local_74.m_y * 0x10) + 0x20))();
        bVar3 = bVar3 ^ (byte)local_5c ^ 1;
      }
      if ((lVar1 != 0) && (local_50[0] != local_40)) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (bVar3 != 0) {
        Point::Point(&local_78,x,y);
        if (!bVar10) {
          if ((local_60 & 1) == 0) {
            uVar6._0_2_ = local_78.m_x;
            uVar6._2_2_ = local_78.m_y;
            return (Point)uVar6;
          }
          goto LAB_00107529;
        }
        break;
      }
      bVar10 = 6 < x;
      x = x + 1;
    } while (x != 8);
    uVar5 = (int)local_58 + 1;
    uVar8 = CONCAT71((int7)((ulong)pvVar7 >> 8),6 < (ushort)local_58);
    uVar9 = (ulong)uVar5;
    if ((short)uVar5 == 8) {
LAB_00107529:
      Point::Point(&local_78,-1,-1);
      return local_78;
    }
  } while( true );
}

Assistant:

Point Board::find_king(Color color) const {
    for (dimension i = 0; i < SIZE; i++) {
        for (dimension j = 0; j < SIZE; j++) {
            if ((m_board[{j, i}] != nullptr) && (m_board[{j, i}]->get_representation() == "Kg") &&
                (m_board[{j, i}]->get_color() == color)) {
                return Point(j, i);
            }
        }
    }

    return Point(-1, -1);
}